

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O0

void __thiscall
flatbuffers::vector_downward<unsigned_int>::vector_downward
          (vector_downward<unsigned_int> *this,size_t initial_size,Allocator *allocator,
          bool own_allocator,size_t buffer_minalign,uint max_size)

{
  uint max_size_local;
  size_t buffer_minalign_local;
  bool own_allocator_local;
  Allocator *allocator_local;
  size_t initial_size_local;
  vector_downward<unsigned_int> *this_local;
  
  this->allocator_ = allocator;
  this->own_allocator_ = own_allocator;
  this->initial_size_ = initial_size;
  this->max_size_ = max_size;
  this->buffer_minalign_ = buffer_minalign;
  this->reserved_ = 0;
  this->size_ = 0;
  this->buf_ = (uint8_t *)0x0;
  this->cur_ = (uint8_t *)0x0;
  this->scratch_ = (uint8_t *)0x0;
  return;
}

Assistant:

explicit vector_downward(size_t initial_size, Allocator *allocator,
                           bool own_allocator, size_t buffer_minalign,
                           const SizeT max_size = FLATBUFFERS_MAX_BUFFER_SIZE)
      : allocator_(allocator),
        own_allocator_(own_allocator),
        initial_size_(initial_size),
        max_size_(max_size),
        buffer_minalign_(buffer_minalign),
        reserved_(0),
        size_(0),
        buf_(nullptr),
        cur_(nullptr),
        scratch_(nullptr) {}